

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

ObjTypeSpecFldInfo * __thiscall Func::GetGlobalObjTypeSpecFldInfo(Func *this,uint propertyInfoId)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FunctionJITTimeInfo *this_00;
  undefined4 *puVar4;
  
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
  uVar3 = FunctionJITTimeInfo::GetGlobalObjTypeSpecFldInfoCount(this_00);
  if (uVar3 <= propertyInfoId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x60b,
                       "(propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount())"
                       ,
                       "propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return this->topFunc->m_globalObjTypeSpecFldInfoArray[propertyInfoId];
}

Assistant:

ObjTypeSpecFldInfo*
Func::GetGlobalObjTypeSpecFldInfo(uint propertyInfoId) const
{
    Assert(propertyInfoId < GetTopFunc()->GetWorkItem()->GetJITTimeInfo()->GetGlobalObjTypeSpecFldInfoCount());
    return GetTopFunc()->m_globalObjTypeSpecFldInfoArray[propertyInfoId];
}